

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::array::content::set_length(content *this,size_t len)

{
  type_traits *ptVar1;
  void *pvVar2;
  uint8_t *ptr;
  size_t len_local;
  content *this_local;
  
  ptVar1 = buffer::content_traits((buffer *)this);
  if (ptVar1 == (type_traits *)0x0) {
    if (*(ulong *)(this + 0x10) < len) {
      this_local._7_1_ = false;
    }
    else {
      if (*(ulong *)(this + 0x18) < len) {
        pvVar2 = data(this);
        memset((void *)((long)pvVar2 + *(long *)(this + 0x18)),0,len - *(long *)(this + 0x18));
      }
      *(size_t *)(this + 0x18) = len;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool array::content::set_length(size_t len)
{
	if (content_traits()) {
		return false;
	}
	if (len > _size) {
		return false;
	}
	if (len > _used) {
		uint8_t *ptr = static_cast<uint8_t *>(data());
		memset(ptr + _used, 0, len - _used);
	}
	_used = len;
	return true;
}